

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          char *s,size_type n2)

{
  int iVar1;
  basic_string_view<char,_std::char_traits<char>_> other;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20 = substr(this,pos1,n1);
  other.size_ = n2;
  other.data_ = s;
  iVar1 = compare(&local_20,other);
  return iVar1;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, CharT const * s, size_type n2 ) const // (6)
    {
        return substr( pos1, n1 ).compare( basic_string_view( s, n2 ) );
    }